

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_AngularDimension2Extra::Read(ON_AngularDimension2Extra *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool local_21;
  int local_20;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_AngularDimension2Extra *this_local;
  
  iStack_1c = 1;
  local_20 = 0;
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  local_21 = ON_BinaryArchive::BeginRead3dmChunk
                       (archive,0x40008000,&stack0xffffffffffffffe4,&local_20);
  if (iStack_1c != 1) {
    local_21 = false;
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::ReadDouble(_minor_version,this->m_dimpoint_offset);
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::ReadDouble(_minor_version,this->m_dimpoint_offset + 1);
  }
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
  if (!bVar1) {
    local_21 = false;
  }
  return local_21;
}

Assistant:

bool ON_AngularDimension2Extra::Read(ON_BinaryArchive& archive)
{
  int major_version = 1;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if(major_version != 1)
    rc = false;

  if(rc) rc = archive.ReadDouble(&m_dimpoint_offset[0]);
  if(rc) rc = archive.ReadDouble(&m_dimpoint_offset[1]);

  if ( !archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}